

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Component.cpp
# Opt level: O0

void __thiscall Component::Component(Component *this,path *path)

{
  long in_RDI;
  path *in_stack_ffffffffffffff68;
  path *in_stack_ffffffffffffff70;
  allocator local_25 [20];
  allocator local_11 [17];
  
  boost::filesystem::path::path(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(in_RDI + 0x20),"",local_11);
  std::allocator<char>::~allocator((allocator<char> *)local_11);
  std::
  unordered_set<Component_*,_std::hash<Component_*>,_std::equal_to<Component_*>,_std::allocator<Component_*>_>
  ::unordered_set((unordered_set<Component_*,_std::hash<Component_*>,_std::equal_to<Component_*>,_std::allocator<Component_*>_>
                   *)0x197461);
  std::
  unordered_set<Component_*,_std::hash<Component_*>,_std::equal_to<Component_*>,_std::allocator<Component_*>_>
  ::unordered_set((unordered_set<Component_*,_std::hash<Component_*>,_std::equal_to<Component_*>,_std::allocator<Component_*>_>
                   *)0x197474);
  std::
  unordered_set<Component_*,_std::hash<Component_*>,_std::equal_to<Component_*>,_std::allocator<Component_*>_>
  ::unordered_set((unordered_set<Component_*,_std::hash<Component_*>,_std::equal_to<Component_*>,_std::allocator<Component_*>_>
                   *)0x19748a);
  std::
  unordered_set<Component_*,_std::hash<Component_*>,_std::equal_to<Component_*>,_std::allocator<Component_*>_>
  ::unordered_set((unordered_set<Component_*,_std::hash<Component_*>,_std::equal_to<Component_*>,_std::allocator<Component_*>_>
                   *)0x1974a0);
  std::
  unordered_set<Component_*,_std::hash<Component_*>,_std::equal_to<Component_*>,_std::allocator<Component_*>_>
  ::unordered_set((unordered_set<Component_*,_std::hash<Component_*>,_std::equal_to<Component_*>,_std::allocator<Component_*>_>
                   *)0x1974b6);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x1974cc);
  std::unordered_set<File_*,_std::hash<File_*>,_std::equal_to<File_*>,_std::allocator<File_*>_>::
  unordered_set((unordered_set<File_*,_std::hash<File_*>,_std::equal_to<File_*>,_std::allocator<File_*>_>
                 *)0x1974e2);
  *(undefined1 *)(in_RDI + 0x1c0) = 0;
  *(undefined1 *)(in_RDI + 0x1c1) = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(in_RDI + 0x1c8),"add_library",local_25);
  std::allocator<char>::~allocator((allocator<char> *)local_25);
  *(undefined8 *)(in_RDI + 0x1e8) = 0;
  *(undefined8 *)(in_RDI + 0x1f0) = 0;
  std::__cxx11::string::string((string *)(in_RDI + 0x1f8));
  std::__cxx11::string::string((string *)(in_RDI + 0x218));
  *(undefined1 *)(in_RDI + 0x238) = 0;
  return;
}

Assistant:

Component::Component(const filesystem::path &path)
        : root(path), name(""), recreate(false), hasAddonCmake(false), type("add_library"), index(0), lowlink(0), onStack(false) {
}